

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O0

void __thiscall QtMWidgets::Switch::setOnColor(Switch *this,QColor *c)

{
  undefined8 uVar1;
  SwitchPrivate *pSVar2;
  ulong uVar3;
  QColor *c_local;
  Switch *this_local;
  
  pSVar2 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(&this->d);
  uVar3 = QColor::operator!=(&pSVar2->onColor,c);
  if ((uVar3 & 1) != 0) {
    pSVar2 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
             ::operator->(&this->d);
    uVar1 = *(undefined8 *)c;
    *(undefined8 *)((long)&(pSVar2->onColor).ct + 2) = *(undefined8 *)((long)&c->ct + 2);
    *(undefined8 *)&pSVar2->onColor = uVar1;
    pSVar2 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
             ::operator->(&this->d);
    if ((pSVar2->state == NotAcceptedUncheck) || (pSVar2->state == AcceptedCheck)) {
      QWidget::update();
    }
  }
  return;
}

Assistant:

void
Switch::setOnColor( const QColor & c )
{
	if( d->onColor != c )
	{
		d->onColor = c;

		switch( d->state )
		{
			case AcceptedCheck :
			case NotAcceptedUncheck :
				update();
			break;

			default:
				break;
		}
	}
}